

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pong.cpp
# Opt level: O0

int main(void)

{
  Am_Slot_Key AVar1;
  Am_Slot_Key AVar2;
  ushort uVar3;
  ushort uVar4;
  Am_Wrapper *pAVar5;
  Am_Method_Wrapper *pAVar6;
  Am_Object *pAVar7;
  Am_Constraint *pAVar8;
  Am_Object *pAVar9;
  undefined8 uVar10;
  Am_Value_List *this;
  Am_Object *pAVar11;
  Am_Object *pAVar12;
  Am_Object *pAVar13;
  Am_Object local_1e0;
  Am_Object local_1d8;
  Am_Object local_1d0;
  Am_Object local_1c8;
  Am_Object local_1c0;
  Am_Object local_1b8;
  Am_Object local_1b0;
  Am_Object local_1a8;
  Am_Object local_1a0;
  Am_Object local_198;
  Am_Object local_190;
  Am_Object local_188;
  Am_Object local_180;
  Am_Object local_178;
  Am_Object local_170;
  Am_Formula local_168 [16];
  Am_Object local_158;
  Am_Object local_150;
  Am_Formula local_148 [16];
  Am_Formula local_138 [16];
  Am_Object local_128;
  Am_Object local_120;
  Am_Formula local_118 [16];
  Am_Formula local_108 [16];
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Value_List local_d0 [16];
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Formula local_a0 [16];
  Am_Object local_90;
  Am_Object local_88;
  Am_Formula local_80 [16];
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Time local_38 [24];
  Am_Object local_20;
  Am_Font local_18 [8];
  Am_Font bigfont;
  
  Am_Initialize();
  Am_Font::Am_Font(local_18,Am_FONT_SERIF,true,false,false,Am_FONT_LARGE);
  Am_Object::Create((char *)&local_20);
  uVar3 = Am_Object::Set((ushort)&local_20,true,0);
  uVar3 = Am_Object::Set(uVar3,true,0);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,true,1);
  uVar3 = Am_Object::Set(uVar3,0xcd,0xffffff9c);
  Am_Time::Am_Time(local_38,0x14);
  pAVar5 = Am_Time::operator_cast_to_Am_Wrapper_(local_38);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xe9,(ulong)pAVar5);
  Am_Object::Create((char *)&local_48);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&ball_anim_method);
  pAVar7 = (Am_Object *)Am_Object::Set((ushort)&local_48,(Am_Method_Wrapper *)0xc8,(ulong)pAVar6);
  pAVar7 = (Am_Object *)Am_Object::operator=(&anim_cmd,pAVar7);
  Am_Object::Am_Object(&local_40,pAVar7);
  pAVar7 = (Am_Object *)Am_Object::Set_Part(uVar3,(Am_Object *)0xc5,(ulong)&local_40);
  Am_Object::operator=(&anim,pAVar7);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Time::~Am_Time(local_38);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Create((char *)&local_50);
  uVar3 = Am_Object::Set((ushort)&local_50,(char *)0x6c,0x107089);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,600);
  uVar3 = Am_Object::Set(uVar3,0x67,0x1c2);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER1_SCORE,0);
  uVar3 = Am_Object::Add(uVar3,(uint)PLAYER2_SCORE,0);
  AVar1 = LABEL1;
  Am_Object::Create((char *)&local_60);
  uVar4 = Am_Object::Set((ushort)&local_60,100,10);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x107095);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_58,pAVar7);
  uVar3 = Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar1,(ulong)&local_58);
  AVar2 = SCORE1;
  Am_Object::Create((char *)&local_70);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar4 = Am_Object::Set((ushort)&local_70,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)right_of_label1);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar8);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_80);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_(local_80);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar8);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar8);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_68,pAVar7);
  uVar3 = Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar2,(ulong)&local_68);
  uVar3 = Am_Object::Set(uVar3,0xa0,10);
  AVar2 = SCORE2;
  Am_Object::Create((char *)&local_90);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar4 = Am_Object::Set((ushort)&local_90,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,(ulong)pAVar8);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  AVar1 = SCORE;
  Am_From_Owner((ushort)local_a0);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_(local_a0);
  uVar4 = Am_Object::Add(uVar4,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar8);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)score_as_string);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0xab,(ulong)pAVar8);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  Am_Object::Am_Object(&local_88,pAVar7);
  uVar3 = Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar2,(ulong)&local_88);
  AVar1 = LABEL2;
  Am_Object::Create((char *)&local_b0);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_of_score2);
  uVar4 = Am_Object::Set((ushort)&local_b0,(Am_Constraint *)0x64,(ulong)pAVar8);
  uVar4 = Am_Object::Set(uVar4,0x65,0xc);
  uVar4 = Am_Object::Set(uVar4,(char *)0xab,0x107095);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xac,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar7 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  Am_Object::Am_Object(&local_a8,pAVar7);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(uVar3,(Am_Object *)(ulong)AVar1,(ulong)&local_a8);
  Am_Object::Create((char *)&local_c0);
  uVar3 = Am_Object::Set((ushort)&local_c0,0x65,10);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar8);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x94,(ulong)pAVar8);
  uVar3 = Am_Object::Set(uVar3,0x95,10);
  uVar3 = Am_Object::Set(uVar3,true,0);
  Am_Value_List::Am_Value_List(local_d0);
  Am_Object::Create((char *)&local_d8);
  uVar4 = Am_Object::Set((ushort)&local_d8,(char *)0x150,0x1070bb);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&new_game_method);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  uVar10 = Am_Value_List::Add(local_d0,pAVar5,1);
  Am_Object::Create((char *)&local_e0);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_e0);
  uVar10 = Am_Value_List::Add(uVar10,pAVar5,1);
  Am_Object::Create((char *)&local_e8);
  uVar4 = Am_Object::Set((ushort)&local_e8,(char *)0x150,0x1070d1);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&connect_to_remote_method);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  this = (Am_Value_List *)Am_Value_List::Add(uVar10,pAVar5,1);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  pAVar11 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xa2,(ulong)pAVar5);
  Am_Object::Am_Object(&local_b8,pAVar11);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(pAVar7,SUB81(&local_b8,0),1);
  Am_Object::Create((char *)&local_f8);
  uVar3 = Am_Object::Set((ushort)&local_f8,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_108);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_(local_108);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar8);
  Am_From_Owner((ushort)local_118,0x67,1.0);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_(local_118);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar8);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar11 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_f0,pAVar11);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(pAVar7,SUB81(&local_f0,0),1);
  Am_Object::Create((char *)&local_128);
  uVar3 = Am_Object::Set((ushort)&local_128,100,0);
  uVar3 = Am_Object::Set(uVar3,0x65,0x32);
  Am_From_Owner((ushort)local_138);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_(local_138);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,(ulong)pAVar8);
  Am_From_Owner((ushort)local_148,0x67,1.0);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_(local_148);
  pAVar11 = (Am_Object *)Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar8);
  Am_Object::Create((char *)&local_158);
  uVar3 = Am_Object::Set((ushort)&local_158,0x65,0);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar8);
  uVar3 = Am_Object::Set(uVar3,0x66,3);
  Am_From_Owner((ushort)local_168);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_(local_168);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar8);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_150,pAVar12);
  pAVar11 = (Am_Object *)Am_Object::Add_Part(pAVar11,SUB81(&local_150,0),1);
  Am_Object::Create((char *)&local_178);
  uVar3 = Am_Object::Set((ushort)&local_178,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,10);
  uVar3 = Am_Object::Set(uVar3,0x66,10);
  uVar3 = Am_Object::Set(uVar3,0x67,0x3c);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Create((char *)&local_188);
  pAVar6 = Am_Current_Location_Method::operator_cast_to_Am_Method_Wrapper_(&paddle_interim_do);
  uVar3 = Am_Object::Set((ushort)&local_188,(Am_Method_Wrapper *)0xc8,(ulong)pAVar6);
  pAVar13 = (Am_Object *)Am_Object::Set(uVar3,0xca,0);
  Am_Object::Am_Object(&local_180,pAVar13);
  pAVar12 = (Am_Object *)Am_Object::Add_Part(pAVar12,SUB81(&local_180,0),1);
  pAVar12 = (Am_Object *)Am_Object::operator=(&paddle1,pAVar12);
  Am_Object::Am_Object(&local_170,pAVar12);
  uVar3 = Am_Object::Add_Part(pAVar11,SUB81(&local_170,0),1);
  pAVar11 = (Am_Object *)Am_Object::Set(uVar3,0xa0,10);
  Am_Object::Create((char *)&local_198);
  uVar3 = Am_Object::Set((ushort)&local_198,0x65,200);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar8);
  uVar3 = Am_Object::Set(uVar3,0x66,10);
  uVar3 = Am_Object::Set(uVar3,0x67,0x3c);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Create((char *)&local_1a8);
  pAVar6 = Am_Current_Location_Method::operator_cast_to_Am_Method_Wrapper_(&paddle_interim_do);
  uVar3 = Am_Object::Set((ushort)&local_1a8,(Am_Method_Wrapper *)0xc8,(ulong)pAVar6);
  pAVar13 = (Am_Object *)Am_Object::Set(uVar3,0xca,0);
  Am_Object::Am_Object(&local_1a0,pAVar13);
  pAVar12 = (Am_Object *)Am_Object::Add_Part(pAVar12,SUB81(&local_1a0,0),1);
  pAVar12 = (Am_Object *)Am_Object::operator=(&paddle2,pAVar12);
  Am_Object::Am_Object(&local_190,pAVar12);
  pAVar11 = (Am_Object *)Am_Object::Add_Part(pAVar11,SUB81(&local_190,0),1);
  Am_Object::Create((char *)&local_1b8);
  uVar3 = Am_Object::Set((ushort)&local_1b8,true,0);
  uVar3 = Am_Object::Set(uVar3,0x65,200);
  uVar3 = Am_Object::Set(uVar3,100,200);
  uVar3 = Am_Object::Set(uVar3,0x66,0x15);
  uVar3 = Am_Object::Set(uVar3,0x67,0x15);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0x6b,(ulong)pAVar5);
  pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0x6a,(ulong)pAVar5);
  Am_Object::Am_Object(&local_1c0,(Am_Object *)&anim);
  pAVar12 = (Am_Object *)Am_Object::Add_Part(pAVar12,SUB81(&local_1c0,0),1);
  pAVar12 = (Am_Object *)Am_Object::operator=(&ball,pAVar12);
  Am_Object::Am_Object(&local_1b0,pAVar12);
  pAVar11 = (Am_Object *)Am_Object::Add_Part(pAVar11,SUB81(&local_1b0,0),1);
  Am_Object::Create((char *)&local_1d0);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_X_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set((ushort)&local_1d0,(Am_Constraint *)0x64,(ulong)pAVar8);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_
                     ((Am_Formula *)&Am_Center_Y_Is_Center_Of_Owner);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,(ulong)pAVar8);
  pAVar5 = Am_Font::operator_cast_to_Am_Wrapper_(local_18);
  uVar3 = Am_Object::Set(uVar3,(Am_Wrapper *)0xac,(ulong)pAVar5);
  uVar3 = Am_Object::Set(uVar3,0x66,100);
  uVar3 = Am_Object::Set(uVar3,0x67,100);
  Am_Object::Create((char *)&local_1d8);
  uVar4 = Am_Object::Set((ushort)&local_1d8,(char *)0x150,0x107106);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&start_game);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar4,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar12 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xc5,(ulong)pAVar5);
  pAVar12 = (Am_Object *)Am_Object::operator=(&start_button,pAVar12);
  Am_Object::Am_Object(&local_1c8,pAVar12);
  pAVar11 = (Am_Object *)Am_Object::Add_Part(pAVar11,SUB81(&local_1c8,0),1);
  pAVar11 = (Am_Object *)Am_Object::operator=(&main_group,pAVar11);
  Am_Object::Am_Object(&local_120,pAVar11);
  pAVar7 = (Am_Object *)Am_Object::Add_Part(pAVar7,SUB81(&local_120,0),1);
  Am_Object::operator=(&window,pAVar7);
  Am_Object::~Am_Object(&local_120);
  Am_Object::~Am_Object(&local_1c8);
  Am_Object::~Am_Object(&local_1d8);
  Am_Object::~Am_Object(&local_1d0);
  Am_Object::~Am_Object(&local_1b0);
  Am_Object::~Am_Object(&local_1c0);
  Am_Object::~Am_Object(&local_1b8);
  Am_Object::~Am_Object(&local_190);
  Am_Object::~Am_Object(&local_1a0);
  Am_Object::~Am_Object(&local_1a8);
  Am_Object::~Am_Object(&local_198);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_180);
  Am_Object::~Am_Object(&local_188);
  Am_Object::~Am_Object(&local_178);
  Am_Object::~Am_Object(&local_150);
  Am_Formula::~Am_Formula(local_168);
  Am_Object::~Am_Object(&local_158);
  Am_Formula::~Am_Formula(local_148);
  Am_Formula::~Am_Formula(local_138);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&local_f0);
  Am_Formula::~Am_Formula(local_118);
  Am_Formula::~Am_Formula(local_108);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::~Am_Object(&local_d8);
  Am_Value_List::~Am_Value_List(local_d0);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_88);
  Am_Formula::~Am_Formula(local_a0);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_68);
  Am_Formula::~Am_Formula(local_80);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Am_Object(&local_1e0,(Am_Object *)&window);
  Am_Object::Add_Part((Am_Object *)&Am_Screen,SUB81(&local_1e0,0),1);
  Am_Object::~Am_Object(&local_1e0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Font::~Am_Font(local_18);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();
  Am_Font bigfont(Am_FONT_SERIF, true, false, false, Am_FONT_LARGE);
  anim =
      Am_Animation_Interactor.Create("anim")
          .Set(Am_START_WHEN, false)
          .Set(Am_STOP_WHEN, false)
          .Set(Am_START_WHERE_TEST, true)
          .Set(Am_RUN_ALSO, true)
          .Set(Am_PRIORITY, -100)            //let other interactors run
          .Set(Am_REPEAT_DELAY, Am_Time(20)) //milliseconds between increments
          .Set_Part(Am_COMMAND,
                    anim_cmd =
                        Am_Animation_Command.Create("anim_cmd")
                            .Set(Am_INTERIM_DO_METHOD, ball_anim_method));
  window =
      Am_Window.Create("Main_Window")
          .Set(Am_TITLE, "Amulet PONG")
          .Set(Am_FILL_STYLE, Am_Amulet_Purple)
          .Set(Am_WIDTH, 600)
          .Set(Am_HEIGHT, 450)
          .Add(PLAYER1_SCORE, 0)
          .Add(PLAYER2_SCORE, 0)
          .Add_Part(LABEL1, Am_Text.Create("label1")
                                .Set(Am_LEFT, 10)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Red))
          .Add_Part(SCORE1, Am_Text.Create("score1")
                                .Set(Am_LINE_STYLE, Am_Red)
                                .Set(Am_LEFT, right_of_label1)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER1_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Set(Am_RIGHT_OFFSET, 10)
          .Add_Part(SCORE2, Am_Text.Create("score2")
                                .Set(Am_LINE_STYLE, Am_Blue)
                                .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                                .Set(Am_TOP, score_top)
                                .Add(SCORE, Am_From_Owner(PLAYER2_SCORE))
                                .Set(Am_TEXT, score_as_string)
                                .Set(Am_FONT, bigfont))
          .Add_Part(LABEL2, Am_Text.Create("label2")
                                .Set(Am_LEFT, left_of_score2)
                                .Set(Am_TOP, score_top)
                                .Set(Am_TEXT, "Score:")
                                .Set(Am_FONT, bigfont)
                                .Set(Am_LINE_STYLE, Am_Blue))
          .Add_Part(
              Am_Button_Panel.Create("buttons")
                  .Set(Am_TOP, score_top - 2)
                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_H_SPACING, 10)
                  .Set(Am_FIXED_WIDTH, false)
                  .Set(Am_ITEMS,
                       Am_Value_List()
                           .Add(Am_Command.Create("new game")
                                    .Set(Am_LABEL, "New Game")
                                    .Set(Am_DO_METHOD, new_game_method))
                           .Add(Am_Quit_No_Ask_Command.Create())
                           .Add(Am_Command.Create("connect user")
                                    .Set(Am_LABEL, "Connect to Remote User")
                                    .Set(Am_DO_METHOD,
                                         connect_to_remote_method))))
          .Add_Part(Am_Border_Rectangle.Create()
                        .Set(Am_LEFT, 0)
                        .Set(Am_TOP, top_height)
                        .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                        .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                        .Set(Am_FILL_STYLE, Am_Black))
          .Add_Part(
              main_group =
                  Am_Group.Create("main group")
                      .Set(Am_LEFT, 0)
                      .Set(Am_TOP, top_height)
                      .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                      .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT, -top_height))
                      .Add_Part(
                          Am_Rectangle.Create("center")
                              .Set(Am_TOP, 0)
                              .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                              .Set(Am_WIDTH, 3)
                              .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                              .Set(Am_LINE_STYLE, Am_No_Style)
                              .Set(Am_FILL_STYLE, Am_White))
                      .Add_Part(paddle1 =
                                    Am_Rectangle.Create()
                                        .Set(Am_TOP, 200)
                                        .Set(Am_LEFT, 10)
                                        .Set(Am_WIDTH, paddle_width)
                                        .Set(Am_HEIGHT, paddle_height)
                                        .Set(Am_LINE_STYLE, Am_No_Style)
                                        .Set(Am_FILL_STYLE, Am_Red)
                                        .Add_Part(Am_Move_Grow_Interactor
                                                      .Create("paddle1move")
                                                      .Set(Am_INTERIM_DO_METHOD,
                                                           paddle_interim_do)
                                                      .Set(Am_DO_METHOD, 0L)))
                      .Set(Am_RIGHT_OFFSET, 10)
                      .Add_Part(
                          paddle2 =
                              Am_Rectangle.Create()
                                  .Set(Am_TOP, 200)
                                  .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                                  .Set(Am_WIDTH, paddle_width)
                                  .Set(Am_HEIGHT, paddle_height)
                                  .Set(Am_LINE_STYLE, Am_No_Style)
                                  .Set(Am_FILL_STYLE, Am_Blue)
                                  .Add_Part(Am_Move_Grow_Interactor
                                                .Create("paddle1move")
                                                .Set(Am_INTERIM_DO_METHOD,
                                                     paddle_interim_do)
                                                .Set(Am_DO_METHOD, 0L)))
                      .Add_Part(ball = Am_Arc.Create()
                                           .Set(Am_VISIBLE, false)
                                           .Set(Am_TOP, 200)
                                           .Set(Am_LEFT, 200)
                                           .Set(Am_WIDTH, ball_size)
                                           .Set(Am_HEIGHT, ball_size)
                                           .Set(Am_LINE_STYLE, Am_No_Style)
                                           .Set(Am_FILL_STYLE, Am_Yellow)
                                           .Add_Part(anim))

                      .Add_Part(
                          start_button =
                              Am_Button.Create()
                                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                                  .Set(Am_TOP, Am_Center_Y_Is_Center_Of_Owner)
                                  .Set(Am_FONT, bigfont)
                                  .Set(Am_WIDTH, 100)
                                  .Set(Am_HEIGHT, 100)
                                  .Set(Am_COMMAND,
                                       Am_Command.Create()
                                           .Set(Am_LABEL, "Start!")
                                           .Set(Am_DO_METHOD, start_game))))

      ;
  Am_Screen.Add_Part(window);

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}